

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismModel::_build_k4_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  BitWord *pBVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 *puVar15;
  pointer pSVar16;
  _List_node_base *p_Var17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  pointer pSVar21;
  int iVar22;
  ulong uVar23;
  pointer pSVar24;
  uint uVar25;
  ulong uVar26;
  pointer pSVar27;
  uint uVar28;
  uint i;
  bool bVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  value_type nv;
  value_type common_neighbours;
  undefined1 local_258 [128];
  uint local_1d8;
  anon_union_128_2_84168a9f_for__data local_1d0;
  uint local_150;
  undefined1 local_148 [64];
  undefined1 local_108 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  undefined1 auVar35 [32];
  
  if (size != 0) {
    uVar31 = 0;
    do {
      uVar30 = (uint)uVar31;
      SVOBitset::SVOBitset
                ((SVOBitset *)local_258,
                 (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar30);
      if (uVar30 != 0) {
        uVar10 = uVar30 + 0x3f;
        if (-1 < (int)uVar30) {
          uVar10 = uVar30;
        }
        uVar26 = 0;
        bVar5 = (byte)uVar31 & 0x3f;
        do {
          pBVar12 = (BitWord *)local_258;
          if (0x10 < local_1d8) {
            pBVar12 = (BitWord *)local_258._0_8_;
          }
          uVar8 = (uint)uVar26;
          uVar18 = uVar8 + 0x3f;
          if (-1 < (int)uVar8) {
            uVar18 = uVar8;
          }
          iVar22 = (int)uVar18 >> 6;
          if ((pBVar12[iVar22] >> (uVar26 & 0x3f) & 1) != 0) {
            SVOBitset::SVOBitset
                      ((SVOBitset *)&local_1d0,
                       (graph_rows->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar8);
            SVOBitset::operator&=((SVOBitset *)&local_1d0,(SVOBitset *)local_258);
            uVar18 = local_150;
            uVar32 = (ulong)local_150;
            uVar13 = &local_1d0;
            if (0x10 < uVar32) {
              uVar13 = local_1d0.short_data[0];
            }
            auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            *(ulong *)(uVar13 + (long)((int)uVar10 >> 6) * 8) =
                 *(ulong *)(uVar13 + (long)((int)uVar10 >> 6) * 8) &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            uVar13 = &local_1d0;
            if (0x10 < uVar32) {
              uVar13 = local_1d0.long_data;
            }
            uVar26 = 1L << (uVar26 & 0x3f);
            *(ulong *)(uVar13 + (long)iVar22 * 8) = *(ulong *)(uVar13 + (long)iVar22 * 8) & ~uVar26;
            uVar13 = local_1d0.long_data;
            uVar14 = &local_1d0;
            if (0x10 < uVar32) {
              uVar14 = local_1d0.long_data;
            }
            if (uVar32 != 0) {
              auVar37 = vpbroadcastq_avx512f();
              uVar23 = 0;
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar40 = auVar38;
                auVar38 = vpbroadcastq_avx512f();
                auVar38 = vporq_avx512f(auVar38,auVar36);
                uVar20 = vpcmpuq_avx512f(auVar38,auVar37,2);
                auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar14 + uVar23 * 8));
                auVar39._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar38._8_8_;
                auVar39._0_8_ = (ulong)((byte)uVar20 & 1) * auVar38._0_8_;
                auVar39._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar38._16_8_;
                auVar39._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar38._24_8_;
                auVar39._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar38._32_8_;
                auVar39._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar38._40_8_;
                auVar39._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar38._48_8_;
                auVar39._56_8_ = (uVar20 >> 7) * auVar38._56_8_;
                uVar23 = uVar23 + 8;
                auVar38 = vpopcntq_avx512_vpopcntdq(auVar39);
                auVar34 = vpmovqd_avx512f(auVar38);
                auVar34 = vpaddd_avx2(auVar40._0_32_,auVar34);
                auVar38 = ZEXT3264(auVar34);
              } while ((uVar32 + 7 & 0xfffffffffffffff8) != uVar23);
              auVar34 = vmovdqa32_avx512vl(auVar34);
              bVar29 = (bool)((byte)uVar20 & 1);
              auVar33._0_4_ = (uint)bVar29 * auVar34._0_4_ | (uint)!bVar29 * auVar40._0_4_;
              bVar29 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar33._4_4_ = (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * auVar40._4_4_;
              bVar29 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar33._8_4_ = (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * auVar40._8_4_;
              bVar29 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar33._12_4_ = (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * auVar40._12_4_;
              bVar29 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar35._16_4_ = (uint)bVar29 * auVar34._16_4_ | (uint)!bVar29 * auVar40._16_4_;
              auVar35._0_16_ = auVar33;
              bVar29 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar35._20_4_ = (uint)bVar29 * auVar34._20_4_ | (uint)!bVar29 * auVar40._20_4_;
              bVar29 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar35._24_4_ = (uint)bVar29 * auVar34._24_4_ | (uint)!bVar29 * auVar40._24_4_;
              bVar29 = SUB81(uVar20 >> 7,0);
              auVar35._28_4_ = (uint)bVar29 * auVar34._28_4_ | (uint)!bVar29 * auVar40._28_4_;
              auVar33 = vphaddd_avx(auVar35._16_16_,auVar33);
              auVar33 = vphaddd_avx(auVar33,auVar33);
              auVar33 = vphaddd_avx(auVar33,auVar33);
              uVar25 = uVar18;
              if (1 < auVar33._0_4_) {
                if (uVar18 < 0x11) {
                  auVar36._8_56_ = local_1d0._8_56_;
                  auVar36._0_8_ = local_1d0.short_data[0];
                  auVar36 = vmovdqu64_avx512f(auVar36);
                  auVar38 = vmovdqu64_avx512f(local_1d0._64_64_);
                  puVar15 = local_148;
                  local_108 = vmovdqu64_avx512f(auVar38);
                  local_148 = vmovdqu64_avx512f(auVar36);
                }
                else {
                  puVar15 = (undefined1 *)operator_new__(uVar32 * 8);
                  local_148._0_8_ = puVar15;
                  memmove(puVar15,(void *)uVar13,uVar32 * 8);
                }
                iVar11 = 0;
                uVar23 = 0;
LAB_00130a6e:
                uVar20 = *(ulong *)(puVar15 + uVar23 * 8);
                if (uVar20 == 0) goto code_r0x00130a77;
                iVar7 = 0;
                for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  iVar7 = iVar7 + 1;
                }
                if (iVar7 + 1 != iVar11) {
                  uVar25 = iVar7 - iVar11;
                  bVar29 = false;
                  do {
                    uVar9 = local_150;
                    puVar15 = (undefined1 *)local_148._0_8_;
                    if (uVar18 < 0x11) {
                      puVar15 = local_148;
                    }
                    bVar6 = (byte)uVar25 & 0x3f;
                    uVar19 = uVar25 + 0x3f;
                    if (-1 < (int)uVar25) {
                      uVar19 = uVar25;
                    }
                    *(ulong *)(puVar15 + (long)((int)uVar19 >> 6) * 8) =
                         *(ulong *)(puVar15 + (long)((int)uVar19 >> 6) * 8) &
                         (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                    uVar23 = (ulong)local_150;
                    if (0x10 < uVar23) {
                      puVar15 = (undefined1 *)operator_new__(uVar23 * 8);
                      local_b8._0_8_ = puVar15;
                      memmove(puVar15,local_1d0.long_data,uVar23 * 8);
LAB_00130bc7:
                      iVar11 = 0;
                      uVar20 = 0;
LAB_00130bcb:
                      uVar3 = *(ulong *)(puVar15 + uVar20 * 8);
                      if (uVar3 == 0) goto code_r0x00130bd4;
                      iVar7 = 0;
                      for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
                        iVar7 = iVar7 + 1;
                      }
                      if ((iVar7 + 1 != iVar11) && (!bVar29)) {
                        uVar28 = iVar7 - iVar11;
                        pSVar24 = (graph_rows->
                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        uVar19 = this->max_graphs;
                        pSVar16 = pSVar24 + uVar19 * uVar25;
                        pSVar27 = pSVar24 + (uVar19 * uVar8 + *idx);
                        pSVar24 = pSVar24 + (uVar19 * uVar30 + *idx);
                        do {
                          puVar15 = (undefined1 *)local_b8._0_8_;
                          if (uVar9 < 0x11) {
                            puVar15 = local_b8;
                          }
                          uVar19 = uVar28 + 0x3f;
                          if (-1 < (int)uVar28) {
                            uVar19 = uVar28;
                          }
                          bVar6 = (byte)((int)uVar28 % 0x40) & 0x3f;
                          *(ulong *)(puVar15 + (long)((int)uVar19 >> 6) * 8) =
                               *(ulong *)(puVar15 + (long)((int)uVar19 >> 6) * 8) &
                               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                          if ((((uVar8 != uVar28) && (uVar8 != uVar25)) && (uVar30 != uVar25)) &&
                             (uVar30 != uVar28)) {
                            pSVar21 = pSVar16;
                            if (0x10 < pSVar16->n_words) {
                              pSVar21 = (pointer)(pSVar16->_data).short_data[0];
                            }
                            if (((pSVar21->_data).short_data[(int)uVar19 >> 6] &
                                1L << ((ulong)(uint)((int)uVar28 % 0x40) & 0x3f)) != 0) {
                              pSVar21 = pSVar24;
                              if (0x10 < pSVar24->n_words) {
                                pSVar21 = (pointer)(pSVar24->_data).short_data[0];
                              }
                              (pSVar21->_data).short_data[iVar22] =
                                   (pSVar21->_data).short_data[iVar22] | uVar26;
                              pSVar21 = pSVar27;
                              if (0x10 < pSVar27->n_words) {
                                pSVar21 = (pointer)(pSVar27->_data).short_data[0];
                              }
                              bVar29 = true;
                              (pSVar21->_data).short_data[(int)uVar10 >> 6] =
                                   (pSVar21->_data).short_data[(int)uVar10 >> 6] |
                                   1L << (uVar31 & 0x3f);
                            }
                          }
                          puVar15 = local_b8;
                          if (0x10 < uVar9) {
                            puVar15 = (undefined1 *)local_b8._0_8_;
                          }
                          iVar11 = 0;
                          uVar20 = 0;
                          while (uVar3 = *(ulong *)(puVar15 + uVar20 * 8), uVar3 == 0) {
                            uVar20 = uVar20 + 1;
                            iVar11 = iVar11 + -0x40;
                            if (uVar23 == uVar20) goto LAB_00130d5a;
                          }
                          iVar7 = 0;
                          for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
                            iVar7 = iVar7 + 1;
                          }
                        } while ((iVar7 + 1 != iVar11) && (uVar28 = iVar7 - iVar11, !bVar29));
                      }
LAB_00130d5a:
                      if ((0x10 < uVar9) && ((void *)local_b8._0_8_ != (void *)0x0)) {
                        operator_delete__((void *)local_b8._0_8_);
                      }
                      goto LAB_00130d82;
                    }
                    auVar38._8_56_ = local_1d0._8_56_;
                    auVar38._0_8_ = local_1d0.short_data[0];
                    auVar36 = vmovdqu64_avx512f(auVar38);
                    auVar38 = vmovdqu64_avx512f(local_1d0._64_64_);
                    local_78 = vmovdqu64_avx512f(auVar38);
                    local_b8 = vmovdqu64_avx512f(auVar36);
                    if (uVar23 != 0) {
                      puVar15 = local_b8;
                      goto LAB_00130bc7;
                    }
LAB_00130d82:
                    puVar15 = local_148;
                    if (0x10 < uVar18) {
                      puVar15 = (undefined1 *)local_148._0_8_;
                    }
                    iVar11 = 0;
                    uVar23 = 0;
                    while (uVar20 = *(ulong *)(puVar15 + uVar23 * 8), uVar20 == 0) {
                      uVar23 = uVar23 + 1;
                      iVar11 = iVar11 + -0x40;
                      if (uVar32 == uVar23) goto LAB_00130a90;
                    }
                    iVar7 = 0;
                    for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                      iVar7 = iVar7 + 1;
                    }
                  } while ((iVar7 + 1 != iVar11) && (uVar25 = iVar7 - iVar11, !bVar29));
                }
LAB_00130a90:
                uVar25 = local_150;
                if ((0x10 < uVar18) && ((void *)local_148._0_8_ != (void *)0x0)) {
                  operator_delete__((void *)local_148._0_8_);
                  uVar25 = local_150;
                }
              }
              if ((0x10 < uVar25) &&
                 ((anon_union_128_2_84168a9f_for__data *)local_1d0.short_data[0] !=
                  (anon_union_128_2_84168a9f_for__data *)0x0)) {
                operator_delete__(local_1d0.long_data);
              }
            }
          }
          uVar26 = (ulong)(uVar8 + 1);
        } while (uVar8 + 1 != uVar30);
      }
      if ((0x10 < local_1d8) && ((BitWord *)local_258._0_8_ != (BitWord *)0x0)) {
        operator_delete__((void *)local_258._0_8_);
      }
      uVar31 = (ulong)(uVar30 + 1);
    } while (uVar30 + 1 != size);
  }
  if (pattern) {
    p_Var2 = (_List_node_base *)(local_258 + 0x10);
    _Var4._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    local_258._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"k4","");
    p_Var17 = (_List_node_base *)operator_new(0x30);
    uVar13 = local_258._8_8_;
    p_Var17[1]._M_next = p_Var17 + 2;
    if ((_List_node_base *)local_258._0_8_ == p_Var2) {
      p_Var17[2]._M_next = (_List_node_base *)CONCAT71(local_258._17_7_,local_258[0x10]);
      p_Var17[2]._M_prev = (_List_node_base *)local_258._24_8_;
    }
    else {
      p_Var17[1]._M_next = (_List_node_base *)local_258._0_8_;
      p_Var17[2]._M_next = (_List_node_base *)CONCAT71(local_258._17_7_,local_258[0x10]);
    }
    local_258._8_8_ = 0;
    local_258[0x10] = 0;
    p_Var17[1]._M_prev = (_List_node_base *)uVar13;
    local_258._0_8_ = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var17);
    psVar1 = (size_t *)((long)&(_Var4._M_head_impl)->supplemental_graph_names + 0x10);
    *psVar1 = *psVar1 + 1;
    if ((_List_node_base *)local_258._0_8_ != p_Var2) {
      operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
    }
  }
  *idx = *idx + 1;
  return;
code_r0x00130a77:
  uVar23 = uVar23 + 1;
  iVar11 = iVar11 + -0x40;
  if (uVar32 == uVar23) goto LAB_00130a90;
  goto LAB_00130a6e;
code_r0x00130bd4:
  uVar20 = uVar20 + 1;
  iVar11 = iVar11 + -0x40;
  if (uVar23 == uVar20) goto LAB_00130d5a;
  goto LAB_00130bcb;
}

Assistant:

auto HomomorphismModel::_build_k4_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w)) {
                // are there two common neighbours with an edge between them?
                auto common_neighbours = graph_rows[w * max_graphs + 0];
                common_neighbours &= nv;
                common_neighbours.reset(v);
                common_neighbours.reset(w);
                auto count = common_neighbours.count();
                if (count >= 2) {
                    bool done = false;
                    auto cn1 = common_neighbours;
                    for (auto x = cn1.find_first(); x != decltype(cn1)::npos && ! done; x = cn1.find_first()) {
                        cn1.reset(x);
                        auto cn2 = common_neighbours;
                        for (auto y = cn2.find_first(); y != decltype(cn2)::npos && ! done; y = cn2.find_first()) {
                            cn2.reset(y);
                            if (v != w && v != x && v != y && w != x && w != y && graph_rows[x * max_graphs + 0].test(y)) {
                                graph_rows[v * max_graphs + idx].set(w);
                                graph_rows[w * max_graphs + idx].set(v);
                                done = true;
                            }
                        }
                    }
                }
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("k4");
    ++idx;
}